

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddExact.c
# Opt level: O2

int updateUB(DdManager *table,int oldBound,DdHalfWord *bestOrder,int lower,int upper)

{
  long lVar1;
  int iVar2;
  
  iVar2 = table->keys - table->isolated;
  if (iVar2 < oldBound) {
    for (lVar1 = (long)lower; oldBound = iVar2, lVar1 <= upper; lVar1 = lVar1 + 1) {
      *bestOrder = table->invperm[lVar1];
      bestOrder = bestOrder + 1;
    }
  }
  return oldBound;
}

Assistant:

static int
updateUB(
  DdManager * table,
  int  oldBound,
  DdHalfWord * bestOrder,
  int  lower,
  int  upper)
{
    int i;
    int newBound = table->keys - table->isolated;

    if (newBound < oldBound) {
#ifdef DD_STATS
        (void) fprintf(table->out,"New upper bound = %d\n", newBound);
        fflush(table->out);
#endif
        for (i = lower; i <= upper; i++)
            bestOrder[i-lower] = (DdHalfWord) table->invperm[i];
        return(newBound);
    } else {
        return(oldBound);
    }

}